

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  RTCIntersectArguments *pRVar11;
  code *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  ulong *puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar33;
  float fVar38;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  uint uVar60;
  float fVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  undefined1 local_9e8 [16];
  Geometry *local_9d8;
  ulong local_9d0;
  ulong local_9c8;
  long local_9c0;
  ulong *local_9b8;
  long local_9b0;
  float local_9a8;
  float local_9a4;
  float local_9a0;
  undefined4 local_99c;
  float local_998;
  undefined4 local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  RTCFilterFunctionNArguments local_978;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar29 = ray->tfar, 0.0 <= fVar29)) {
    local_9b8 = local_7d8 + 1;
    fVar67 = (ray->org).field_0.m128[0];
    fVar59 = (ray->org).field_0.m128[1];
    fVar32 = (ray->org).field_0.m128[2];
    fVar49 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar61 = (ray->dir).field_0.m128[0];
    fVar68 = (ray->dir).field_0.m128[1];
    fVar63 = (ray->dir).field_0.m128[2];
    fVar69 = (ray->dir).field_0.m128[3];
    fVar65 = 0.0;
    if (0.0 <= fVar49) {
      fVar65 = fVar49;
    }
    uVar25 = -(uint)(1e-18 <= ABS(fVar61));
    uVar26 = -(uint)(1e-18 <= ABS(fVar68));
    uVar27 = -(uint)(1e-18 <= ABS(fVar63));
    uVar28 = -(uint)(1e-18 <= ABS(fVar69));
    auVar34._0_4_ = (uint)fVar61 & uVar25;
    auVar34._4_4_ = (uint)fVar68 & uVar26;
    auVar34._8_4_ = (uint)fVar63 & uVar27;
    auVar34._12_4_ = (uint)fVar69 & uVar28;
    auVar41._0_8_ = CONCAT44(~uVar26,~uVar25) & 0x219392ef219392ef;
    auVar41._8_4_ = ~uVar27 & 0x219392ef;
    auVar41._12_4_ = ~uVar28 & 0x219392ef;
    auVar41 = auVar41 | auVar34;
    auVar34 = rcpps(auVar34,auVar41);
    fVar45 = auVar34._0_4_;
    fVar47 = auVar34._4_4_;
    fVar49 = auVar34._8_4_;
    fVar45 = (1.0 - auVar41._0_4_ * fVar45) * fVar45 + fVar45;
    fVar47 = (1.0 - auVar41._4_4_ * fVar47) * fVar47 + fVar47;
    fVar49 = (1.0 - auVar41._8_4_ * fVar49) * fVar49 + fVar49;
    uVar21 = (ulong)(fVar45 < 0.0) << 4;
    uVar24 = (ulong)(fVar47 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(fVar49 < 0.0) << 4 | 0x40;
    uVar23 = uVar21 ^ 0x10;
    local_8c8 = mm_lookupmask_ps._240_16_;
    local_8d8 = fVar29;
    fStack_8d4 = fVar29;
    fStack_8d0 = fVar29;
    fStack_8cc = fVar29;
    local_8e8 = fVar32;
    fStack_8e4 = fVar32;
    fStack_8e0 = fVar32;
    fStack_8dc = fVar32;
    local_8f8 = fVar65;
    fStack_8f4 = fVar65;
    fStack_8f0 = fVar65;
    fStack_8ec = fVar65;
    local_908 = fVar49;
    fStack_904 = fVar49;
    fStack_900 = fVar49;
    fStack_8fc = fVar49;
    local_918 = fVar67;
    fStack_914 = fVar67;
    fStack_910 = fVar67;
    fStack_90c = fVar67;
    local_928 = fVar59;
    fStack_924 = fVar59;
    fStack_920 = fVar59;
    fStack_91c = fVar59;
    local_938 = fVar45;
    fStack_934 = fVar45;
    fStack_930 = fVar45;
    fStack_92c = fVar45;
    local_948 = fVar47;
    fStack_944 = fVar47;
    fStack_940 = fVar47;
    fStack_93c = fVar47;
    fVar61 = fVar49;
    fVar68 = fVar49;
    fVar63 = fVar49;
    fVar69 = fVar29;
    fVar71 = fVar29;
    fVar73 = fVar29;
    fVar75 = fVar32;
    fVar53 = fVar32;
    fVar54 = fVar32;
    fVar56 = fVar65;
    fVar33 = fVar65;
    fVar38 = fVar65;
    fVar39 = fVar67;
    fVar40 = fVar67;
    fVar46 = fVar67;
    fVar48 = fVar59;
    fVar50 = fVar59;
    fVar51 = fVar59;
    fVar52 = fVar45;
    fVar55 = fVar45;
    fVar57 = fVar45;
    fVar58 = fVar47;
    fVar70 = fVar47;
    fVar72 = fVar47;
LAB_0056d26c:
    puVar17 = local_7d8;
    if (local_9b8 != puVar17) {
      uVar22 = local_9b8[-1];
      local_9b8 = local_9b8 + -1;
      while ((uVar22 & 8) == 0) {
        pfVar4 = (float *)(uVar22 + 0x20 + uVar21);
        auVar30._0_4_ = (*pfVar4 - fVar67) * fVar45;
        auVar30._4_4_ = (pfVar4[1] - fVar39) * fVar52;
        auVar30._8_4_ = (pfVar4[2] - fVar40) * fVar55;
        auVar30._12_4_ = (pfVar4[3] - fVar46) * fVar57;
        pfVar4 = (float *)(uVar22 + 0x20 + uVar24);
        auVar35._0_4_ = (*pfVar4 - fVar59) * fVar47;
        auVar35._4_4_ = (pfVar4[1] - fVar48) * fVar58;
        auVar35._8_4_ = (pfVar4[2] - fVar50) * fVar70;
        auVar35._12_4_ = (pfVar4[3] - fVar51) * fVar72;
        auVar34 = maxps(auVar30,auVar35);
        pfVar4 = (float *)(uVar22 + 0x20 + uVar20);
        auVar36._0_4_ = (*pfVar4 - fVar32) * fVar49;
        auVar36._4_4_ = (pfVar4[1] - fVar75) * fVar61;
        auVar36._8_4_ = (pfVar4[2] - fVar53) * fVar68;
        auVar36._12_4_ = (pfVar4[3] - fVar54) * fVar63;
        auVar13._4_4_ = fVar56;
        auVar13._0_4_ = fVar65;
        auVar13._8_4_ = fVar33;
        auVar13._12_4_ = fVar38;
        auVar41 = maxps(auVar36,auVar13);
        auVar34 = maxps(auVar34,auVar41);
        pfVar4 = (float *)(uVar22 + 0x20 + uVar23);
        auVar37._0_4_ = (*pfVar4 - fVar67) * fVar45;
        auVar37._4_4_ = (pfVar4[1] - fVar39) * fVar52;
        auVar37._8_4_ = (pfVar4[2] - fVar40) * fVar55;
        auVar37._12_4_ = (pfVar4[3] - fVar46) * fVar57;
        pfVar4 = (float *)(uVar22 + 0x20 + (uVar24 ^ 0x10));
        auVar42._0_4_ = (*pfVar4 - fVar59) * fVar47;
        auVar42._4_4_ = (pfVar4[1] - fVar48) * fVar58;
        auVar42._8_4_ = (pfVar4[2] - fVar50) * fVar70;
        auVar42._12_4_ = (pfVar4[3] - fVar51) * fVar72;
        auVar41 = minps(auVar37,auVar42);
        pfVar4 = (float *)(uVar22 + 0x20 + (uVar20 ^ 0x10));
        auVar43._0_4_ = (*pfVar4 - fVar32) * fVar49;
        auVar43._4_4_ = (pfVar4[1] - fVar75) * fVar61;
        auVar43._8_4_ = (pfVar4[2] - fVar53) * fVar68;
        auVar43._12_4_ = (pfVar4[3] - fVar54) * fVar63;
        auVar44._4_4_ = fVar69;
        auVar44._0_4_ = fVar29;
        auVar44._8_4_ = fVar71;
        auVar44._12_4_ = fVar73;
        auVar44 = minps(auVar43,auVar44);
        auVar41 = minps(auVar41,auVar44);
        auVar31._4_4_ = -(uint)(auVar34._4_4_ <= auVar41._4_4_);
        auVar31._0_4_ = -(uint)(auVar34._0_4_ <= auVar41._0_4_);
        auVar31._8_4_ = -(uint)(auVar34._8_4_ <= auVar41._8_4_);
        auVar31._12_4_ = -(uint)(auVar34._12_4_ <= auVar41._12_4_);
        uVar25 = movmskps((int)puVar17,auVar31);
        if (uVar25 == 0) goto LAB_0056d26c;
        uVar25 = uVar25 & 0xff;
        puVar17 = (ulong *)(uVar22 & 0xfffffffffffffff0);
        lVar18 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar22 = puVar17[lVar18];
        uVar25 = uVar25 - 1 & uVar25;
        uVar19 = (ulong)uVar25;
        if (uVar25 != 0) {
          do {
            *local_9b8 = uVar22;
            local_9b8 = local_9b8 + 1;
            lVar18 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar22 = puVar17[lVar18];
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        }
      }
      local_9b0 = (ulong)((uint)uVar22 & 0xf) - 8;
      uVar22 = uVar22 & 0xfffffffffffffff0;
      for (local_9c0 = 0; local_9c0 != local_9b0; local_9c0 = local_9c0 + 1) {
        lVar18 = local_9c0 * 0x50;
        ppfVar6 = (context->scene->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar22 + 0x30 + lVar18)];
        pfVar4 = pfVar7 + *(uint *)(uVar22 + lVar18);
        fVar29 = *pfVar4;
        fVar67 = pfVar4[1];
        fVar59 = pfVar4[2];
        pfVar4 = pfVar7 + *(uint *)(uVar22 + 0x10 + lVar18);
        pfVar7 = pfVar7 + *(uint *)(uVar22 + 0x20 + lVar18);
        pfVar8 = ppfVar6[*(uint *)(uVar22 + 0x34 + lVar18)];
        pfVar1 = pfVar8 + *(uint *)(uVar22 + 4 + lVar18);
        fVar32 = *pfVar1;
        fVar49 = pfVar1[1];
        fVar61 = pfVar1[2];
        pfVar1 = pfVar8 + *(uint *)(uVar22 + 0x14 + lVar18);
        pfVar8 = pfVar8 + *(uint *)(uVar22 + 0x24 + lVar18);
        pfVar9 = ppfVar6[*(uint *)(uVar22 + 0x38 + lVar18)];
        pfVar2 = pfVar9 + *(uint *)(uVar22 + 8 + lVar18);
        fStack_a00 = *pfVar2;
        fVar68 = pfVar2[1];
        fVar63 = pfVar2[2];
        pfVar2 = pfVar9 + *(uint *)(uVar22 + 0x18 + lVar18);
        pfVar9 = pfVar9 + *(uint *)(uVar22 + 0x28 + lVar18);
        pfVar10 = ppfVar6[*(uint *)(uVar22 + 0x3c + lVar18)];
        pfVar3 = pfVar10 + *(uint *)(uVar22 + 0xc + lVar18);
        fStack_9fc = *pfVar3;
        fVar69 = pfVar3[1];
        fVar65 = pfVar3[2];
        pfVar3 = pfVar10 + *(uint *)(uVar22 + 0x1c + lVar18);
        pfVar10 = pfVar10 + *(uint *)(uVar22 + 0x2c + lVar18);
        puVar5 = (undefined8 *)(uVar22 + 0x30 + lVar18);
        local_8a8 = *puVar5;
        uStack_8a0 = puVar5[1];
        puVar5 = (undefined8 *)(uVar22 + 0x40 + lVar18);
        local_8b8 = *puVar5;
        uStack_8b0 = puVar5[1];
        fVar46 = fVar29 - *pfVar4;
        fVar48 = fVar32 - *pfVar1;
        fStack_9f0 = fStack_a00 - *pfVar2;
        fStack_9ec = fStack_9fc - *pfVar3;
        local_9f8 = (Scene *)CONCAT44(fVar48,fVar46);
        fVar70 = fVar67 - pfVar4[1];
        fVar72 = fVar49 - pfVar1[1];
        fVar74 = fVar68 - pfVar2[1];
        fVar76 = fVar69 - pfVar3[1];
        fVar78 = fVar59 - pfVar4[2];
        fVar79 = fVar61 - pfVar1[2];
        fVar80 = fVar63 - pfVar2[2];
        fVar81 = fVar65 - pfVar3[2];
        fVar33 = *pfVar7 - fVar29;
        fVar38 = *pfVar8 - fVar32;
        fVar39 = *pfVar9 - fStack_a00;
        fVar40 = *pfVar10 - fStack_9fc;
        fVar55 = pfVar7[1] - fVar67;
        fVar57 = pfVar8[1] - fVar49;
        fVar47 = pfVar9[1] - fVar68;
        fVar58 = pfVar10[1] - fVar69;
        fVar50 = pfVar7[2] - fVar59;
        fVar51 = pfVar8[2] - fVar61;
        fVar45 = pfVar9[2] - fVar63;
        fVar52 = pfVar10[2] - fVar65;
        local_a18 = fVar78 * fVar55 - fVar70 * fVar50;
        fStack_a14 = fVar79 * fVar57 - fVar72 * fVar51;
        fStack_a10 = fVar80 * fVar47 - fVar74 * fVar45;
        fStack_a0c = fVar81 * fVar58 - fVar76 * fVar52;
        fVar71 = (ray->org).field_0.m128[0];
        fVar73 = (ray->org).field_0.m128[1];
        fVar75 = (ray->org).field_0.m128[2];
        fVar53 = (ray->dir).field_0.m128[0];
        fVar54 = (ray->dir).field_0.m128[1];
        fVar56 = (ray->dir).field_0.m128[2];
        fVar29 = fVar29 - fVar71;
        fVar32 = fVar32 - fVar71;
        fStack_a00 = fStack_a00 - fVar71;
        fStack_9fc = fStack_9fc - fVar71;
        local_9e8._0_4_ = fVar67 - fVar73;
        local_9e8._4_4_ = fVar49 - fVar73;
        local_9e8._8_4_ = fVar68 - fVar73;
        local_9e8._12_4_ = fVar69 - fVar73;
        fVar86 = fVar29 * fVar54 - local_9e8._0_4_ * fVar53;
        fVar87 = fVar32 * fVar54 - local_9e8._4_4_ * fVar53;
        fVar88 = fStack_a00 * fVar54 - local_9e8._8_4_ * fVar53;
        fVar89 = fStack_9fc * fVar54 - local_9e8._12_4_ * fVar53;
        local_7f8[0] = fVar46 * fVar50 - fVar78 * fVar33;
        local_7f8[1] = fVar48 * fVar51 - fVar79 * fVar38;
        local_7f8[2] = fStack_9f0 * fVar45 - fVar80 * fVar39;
        local_7f8[3] = fStack_9ec * fVar52 - fVar81 * fVar40;
        fVar59 = fVar59 - fVar75;
        fVar61 = fVar61 - fVar75;
        fVar63 = fVar63 - fVar75;
        fVar65 = fVar65 - fVar75;
        local_a08 = (Ray *)CONCAT44(fVar32,fVar29);
        fVar82 = fVar59 * fVar53 - fVar29 * fVar56;
        fVar83 = fVar61 * fVar53 - fVar32 * fVar56;
        fVar84 = fVar63 * fVar53 - fStack_a00 * fVar56;
        fVar85 = fVar65 * fVar53 - fStack_9fc * fVar56;
        local_7e8[0] = fVar70 * fVar33 - fVar46 * fVar55;
        local_7e8[1] = fVar72 * fVar38 - fVar48 * fVar57;
        local_7e8[2] = fVar74 * fVar39 - fStack_9f0 * fVar47;
        local_7e8[3] = fVar76 * fVar40 - fStack_9ec * fVar58;
        fVar71 = local_9e8._0_4_ * fVar56 - fVar59 * fVar54;
        fVar73 = local_9e8._4_4_ * fVar56 - fVar61 * fVar54;
        fVar75 = local_9e8._8_4_ * fVar56 - fVar63 * fVar54;
        fVar77 = local_9e8._12_4_ * fVar56 - fVar65 * fVar54;
        fVar67 = fVar53 * local_a18 + fVar54 * local_7f8[0] + fVar56 * local_7e8[0];
        fVar49 = fVar53 * fStack_a14 + fVar54 * local_7f8[1] + fVar56 * local_7e8[1];
        fVar68 = fVar53 * fStack_a10 + fVar54 * local_7f8[2] + fVar56 * local_7e8[2];
        fVar69 = fVar53 * fStack_a0c + fVar54 * local_7f8[3] + fVar56 * local_7e8[3];
        uVar25 = (uint)fVar67 & 0x80000000;
        uVar26 = (uint)fVar49 & 0x80000000;
        uVar27 = (uint)fVar68 & 0x80000000;
        uVar28 = (uint)fVar69 & 0x80000000;
        local_898._0_4_ =
             (float)((uint)(fVar33 * fVar71 + fVar55 * fVar82 + fVar50 * fVar86) ^ uVar25);
        local_898._4_4_ =
             (float)((uint)(fVar38 * fVar73 + fVar57 * fVar83 + fVar51 * fVar87) ^ uVar26);
        local_898._8_4_ =
             (float)((uint)(fVar39 * fVar75 + fVar47 * fVar84 + fVar45 * fVar88) ^ uVar27);
        local_898._12_4_ =
             (float)((uint)(fVar40 * fVar77 + fVar58 * fVar85 + fVar52 * fVar89) ^ uVar28);
        local_888 = (float)((uint)(fVar71 * fVar46 + fVar82 * fVar70 + fVar86 * fVar78) ^ uVar25);
        fStack_884 = (float)((uint)(fVar73 * fVar48 + fVar83 * fVar72 + fVar87 * fVar79) ^ uVar26);
        fStack_880 = (float)((uint)(fVar75 * fStack_9f0 + fVar84 * fVar74 + fVar88 * fVar80) ^
                            uVar27);
        fStack_87c = (float)((uint)(fVar77 * fStack_9ec + fVar85 * fVar76 + fVar89 * fVar81) ^
                            uVar28);
        local_868 = ABS(fVar67);
        fStack_864 = ABS(fVar49);
        fStack_860 = ABS(fVar68);
        fStack_85c = ABS(fVar69);
        uVar60 = -(uint)(local_898._0_4_ + local_888 <= local_868) &
                 -(uint)((0.0 <= local_888 && 0.0 <= local_898._0_4_) && fVar67 != 0.0) &
                 local_8c8._0_4_;
        uVar62 = -(uint)(local_898._4_4_ + fStack_884 <= fStack_864) &
                 -(uint)((0.0 <= fStack_884 && 0.0 <= local_898._4_4_) && fVar49 != 0.0) &
                 local_8c8._4_4_;
        uVar64 = -(uint)(local_898._8_4_ + fStack_880 <= fStack_860) &
                 -(uint)((0.0 <= fStack_880 && 0.0 <= local_898._8_4_) && fVar68 != 0.0) &
                 local_8c8._8_4_;
        uVar66 = -(uint)(local_898._12_4_ + fStack_87c <= fStack_85c) &
                 -(uint)((0.0 <= fStack_87c && 0.0 <= local_898._12_4_) && fVar69 != 0.0) &
                 local_8c8._12_4_;
        auVar15._4_4_ = uVar62;
        auVar15._0_4_ = uVar60;
        auVar15._8_4_ = uVar64;
        auVar15._12_4_ = uVar66;
        iVar16 = movmskps((int)lVar18,auVar15);
        local_a08 = ray;
        if (iVar16 != 0) {
          local_878 = (float)(uVar25 ^ (uint)(fVar29 * local_a18 +
                                             local_9e8._0_4_ * local_7f8[0] + fVar59 * local_7e8[0])
                             );
          fStack_874 = (float)(uVar26 ^ (uint)(fVar32 * fStack_a14 +
                                              local_9e8._4_4_ * local_7f8[1] + fVar61 * local_7e8[1]
                                              ));
          fStack_870 = (float)(uVar27 ^ (uint)(fStack_a00 * fStack_a10 +
                                              local_9e8._8_4_ * local_7f8[2] + fVar63 * local_7e8[2]
                                              ));
          fStack_86c = (float)(uVar28 ^ (uint)(fStack_9fc * fStack_a0c +
                                              local_9e8._12_4_ * local_7f8[3] +
                                              fVar65 * local_7e8[3]));
          fVar29 = (ray->org).field_0.m128[3];
          fVar67 = ray->tfar;
          local_848._0_4_ =
               -(uint)(local_878 <= fVar67 * local_868 && fVar29 * local_868 < local_878) & uVar60;
          local_848._4_4_ =
               -(uint)(fStack_874 <= fVar67 * fStack_864 && fVar29 * fStack_864 < fStack_874) &
               uVar62;
          local_848._8_4_ =
               -(uint)(fStack_870 <= fVar67 * fStack_860 && fVar29 * fStack_860 < fStack_870) &
               uVar64;
          local_848._12_4_ =
               -(uint)(fStack_86c <= fVar67 * fStack_85c && fVar29 * fStack_85c < fStack_86c) &
               uVar66;
          uVar25 = movmskps(iVar16,local_848);
          if (uVar25 != 0) {
            local_808._4_4_ = fStack_a14;
            local_808._0_4_ = local_a18;
            local_808._8_4_ = fStack_a10;
            local_808._12_4_ = fStack_a0c;
            auVar14._4_4_ = fStack_864;
            auVar14._0_4_ = local_868;
            auVar14._8_4_ = fStack_860;
            auVar14._12_4_ = fStack_85c;
            auVar34 = rcpps(local_808,auVar14);
            fVar29 = auVar34._0_4_;
            fVar67 = auVar34._4_4_;
            fVar59 = auVar34._8_4_;
            fVar32 = auVar34._12_4_;
            fVar29 = (1.0 - local_868 * fVar29) * fVar29 + fVar29;
            fVar67 = (1.0 - fStack_864 * fVar67) * fVar67 + fVar67;
            fVar59 = (1.0 - fStack_860 * fVar59) * fVar59 + fVar59;
            fVar32 = (1.0 - fStack_85c * fVar32) * fVar32 + fVar32;
            local_818[0] = local_878 * fVar29;
            local_818[1] = fStack_874 * fVar67;
            local_818[2] = fStack_870 * fVar59;
            local_818[3] = fStack_86c * fVar32;
            local_838._0_4_ = local_898._0_4_ * fVar29;
            local_838._4_4_ = local_898._4_4_ * fVar67;
            local_838._8_4_ = local_898._8_4_ * fVar59;
            local_838._12_4_ = local_898._12_4_ * fVar32;
            local_828._0_4_ = fVar29 * local_888;
            local_828._4_4_ = fVar67 * fStack_884;
            local_828._8_4_ = fVar59 * fStack_880;
            local_828._12_4_ = fVar32 * fStack_87c;
            local_9c8 = (ulong)(uVar25 & 0xff);
            local_9f8 = context->scene;
            do {
              local_9d0 = 0;
              if (local_9c8 != 0) {
                for (; (local_9c8 >> local_9d0 & 1) == 0; local_9d0 = local_9d0 + 1) {
                }
              }
              local_990 = *(uint *)((long)&local_8a8 + local_9d0 * 4);
              local_9d8 = (local_9f8->geometries).items[local_990].ptr;
              if ((local_9d8->mask & local_a08->mask) == 0) {
                local_9c8 = local_9c8 ^ 1L << (local_9d0 & 0x3f);
              }
              else {
                pRVar11 = context->args;
                if ((pRVar11->filter == (RTCFilterFunctionN)0x0) &&
                   (local_9d8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0056d955:
                  local_a08->tfar = -INFINITY;
                  return;
                }
                local_a18 = SUB84(pRVar11,0);
                fStack_a14 = (float)((ulong)pRVar11 >> 0x20);
                local_9e8._0_8_ = uVar21;
                local_978.context = context->user;
                local_9a8 = local_7f8[local_9d0 - 4];
                local_9a4 = local_7f8[local_9d0];
                local_9a0 = local_7e8[local_9d0];
                local_99c = *(undefined4 *)(local_838 + local_9d0 * 4);
                local_998 = local_818[local_9d0 - 4];
                local_994 = *(undefined4 *)((long)&local_8b8 + local_9d0 * 4);
                local_98c = (local_978.context)->instID[0];
                local_988 = (local_978.context)->instPrimID[0];
                fVar29 = local_a08->tfar;
                local_a08->tfar = local_818[local_9d0];
                local_a1c = -1;
                local_978.valid = &local_a1c;
                local_978.geometryUserPtr = local_9d8->userPtr;
                local_978.hit = (RTCHitN *)&local_9a8;
                local_978.N = 1;
                local_978.ray = (RTCRayN *)local_a08;
                if (((local_9d8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*local_9d8->occlusionFilterN)(&local_978), *local_978.valid != 0)) &&
                   ((pcVar12 = *(code **)(CONCAT44(fStack_a14,local_a18) + 0x10),
                    pcVar12 == (code *)0x0 ||
                    ((((*(byte *)CONCAT44(fStack_a14,local_a18) & 2) == 0 &&
                      (((local_9d8->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*pcVar12)(&local_978), *local_978.valid != 0)))))) goto LAB_0056d955;
                local_a08->tfar = fVar29;
                local_9c8 = local_9c8 ^ 1L << (local_9d0 & 0x3f);
                uVar21 = local_9e8._0_8_;
              }
            } while (local_9c8 != 0);
          }
        }
        ray = local_a08;
        fVar49 = local_908;
        fVar61 = fStack_904;
        fVar68 = fStack_900;
        fVar63 = fStack_8fc;
        fVar29 = local_8d8;
        fVar69 = fStack_8d4;
        fVar71 = fStack_8d0;
        fVar73 = fStack_8cc;
        fVar32 = local_8e8;
        fVar75 = fStack_8e4;
        fVar53 = fStack_8e0;
        fVar54 = fStack_8dc;
        fVar65 = local_8f8;
        fVar56 = fStack_8f4;
        fVar33 = fStack_8f0;
        fVar38 = fStack_8ec;
        fVar67 = local_918;
        fVar39 = fStack_914;
        fVar40 = fStack_910;
        fVar46 = fStack_90c;
        fVar59 = local_928;
        fVar48 = fStack_924;
        fVar50 = fStack_920;
        fVar51 = fStack_91c;
        fVar45 = local_938;
        fVar52 = fStack_934;
        fVar55 = fStack_930;
        fVar57 = fStack_92c;
        fVar47 = local_948;
        fVar58 = fStack_944;
        fVar70 = fStack_940;
        fVar72 = fStack_93c;
      }
      goto LAB_0056d26c;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }